

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O3

int cfg_cmd_handle_query(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *arg_00;
  const_strarray *pcVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  _parsed_argument pa;
  _parsed_argument local_50;
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    cfg_append_printable_line(log,"Query needs section and key, but no value: %s",arg);
    return 0;
  }
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  iVar1 = _do_parse_arg(arg_00,&local_50,log);
  iVar4 = -1;
  if (iVar1 == 0) {
    pcVar5 = "Query needs section and key, but no value: %s";
    if ((local_50.entry_key != (char *)0x0) && (local_50.entry_value == (char *)0x0)) {
      pcVar2 = cfg_db_get_entry_value
                         (db,local_50.section_type,local_50.section_name,local_50.entry_key);
      if (pcVar2 != (const_strarray *)0x0) {
        cfg_append_printable_line(log,"Key \'%s\' has value:",arg);
        pcVar5 = pcVar2->value;
        iVar4 = 0;
        if ((pcVar5 != (char *)0x0) && (iVar4 = 0, pcVar5 < pcVar2->value + pcVar2->length)) {
          iVar4 = 0;
          do {
            cfg_append_printable_line(log,"%s",pcVar5);
            sVar3 = strlen(pcVar5);
            pcVar5 = pcVar5 + sVar3 + 1;
          } while (pcVar5 < pcVar2->value + pcVar2->length);
        }
        goto LAB_00148188;
      }
      pcVar5 = "Key \'%s\' has no value:";
    }
    cfg_append_printable_line(log,pcVar5,arg);
  }
LAB_00148188:
  free(arg_00);
  return iVar4;
}

Assistant:

int
cfg_cmd_handle_query(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  const struct const_strarray *array;
  const char *tmp;
  char *arg_copy;
  int result;

  if (arg == NULL || *arg == 0) {
    cfg_append_printable_line(log, "Query needs section and key, but no value: %s", arg);
    return 0;
  }

  arg_copy = strdup(arg);
  if (!arg_copy) {
    return -1;
  }

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(arg_copy, &pa, log)) {
    goto handle_get_cleanup;
  }

  if (pa.entry_key == NULL || pa.entry_value != NULL) {
    cfg_append_printable_line(log, "Query needs section and key, but no value: %s", arg);
    goto handle_get_cleanup;
  }

  array = cfg_db_get_entry_value(db, pa.section_type, pa.section_name, pa.entry_key);
  if (array) {
    cfg_append_printable_line(log, "Key '%s' has value:", arg);
    strarray_for_each_element(array, tmp) {
      cfg_append_printable_line(log, "%s", tmp);
    }
    result = 0;
  }
  else {
    cfg_append_printable_line(log, "Key '%s' has no value:", arg);
  }

handle_get_cleanup:
  free(arg_copy);
  return result;
}